

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_tab.c
# Opt level: O1

GCtab * lj_tab_new(lua_State *L,uint32_t asize,uint32_t hbits)

{
  undefined4 *puVar1;
  uint32_t uVar2;
  uint64_t uVar3;
  GCtab *pGVar4;
  long lVar5;
  
  pGVar4 = newtab(L,asize,hbits);
  if ((ulong)pGVar4->asize != 0) {
    memset((void *)(pGVar4->array).ptr64,0xff,(ulong)pGVar4->asize << 3);
  }
  uVar2 = pGVar4->hmask;
  if (uVar2 != 0) {
    uVar3 = (pGVar4->node).ptr64;
    lVar5 = 0;
    do {
      *(undefined8 *)(uVar3 + 0x10 + lVar5) = 0;
      puVar1 = (undefined4 *)(uVar3 + lVar5);
      *puVar1 = 0xffffffff;
      puVar1[1] = 0xffffffff;
      puVar1[2] = 0xffffffff;
      puVar1[3] = 0xffffffff;
      lVar5 = lVar5 + 0x18;
    } while ((ulong)(uVar2 + 1 + (uint)(uVar2 == 0xffffffff)) * 0x18 != lVar5);
  }
  return pGVar4;
}

Assistant:

GCtab *lj_tab_new(lua_State *L, uint32_t asize, uint32_t hbits)
{
  GCtab *t = newtab(L, asize, hbits);
  clearapart(t);
  if (t->hmask > 0) clearhpart(t);
  return t;
}